

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O2

bool __thiscall Hpipe::Cond::included_in(Cond *this,Cond *cond)

{
  int i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 != 0x100; uVar1 = uVar1 + 1) {
    if ((((this->p).super__Base_bitset<4UL>._M_w[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) != 0) &&
       (((cond->p).super__Base_bitset<4UL>._M_w[uVar1 >> 6] & 1L << ((byte)uVar1 & 0x3f)) == 0))
    break;
  }
  return 0xff < uVar1;
}

Assistant:

bool Cond::included_in( const Cond &cond ) const {
    for( int i = 0; i < p_size; ++i )
        if ( p[ i ] and not cond.p[ i ] )
            return false;
    return true;
}